

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
Validator_invalidElementIdAttribute_Test::~Validator_invalidElementIdAttribute_Test
          (Validator_invalidElementIdAttribute_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, invalidElementIdAttribute)
{
    const std::vector<std::string> expectedIssues = {
        "Model 'valid_name' does not have a valid 'id' attribute, '993-++$@'.",
    };
    const std::vector<std::string> expectedSpecificationHeadings = {
        "1.2.5.1.1",
    };
    const std::vector<std::string> expectedUrls = {
        "https://cellml-specification.readthedocs.io/en/latest/reference/formal_and_informative/specA02.html?issue=XML_ID_ATTRIBUTE",
    };

    libcellml::ModelPtr model = libcellml::Model::create("valid_name");
    model->setId("993-++$@");

    libcellml::ValidatorPtr v = libcellml::Validator::create();

    v->validateModel(model);

    EXPECT_EQ_ISSUES_SPECIFICATION_HEADINGS_URLS(expectedIssues, expectedSpecificationHeadings, expectedUrls, v);
}